

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void lowbd_blend_a64_d16_mask_subw1_subh1_w16_avx2
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m256i *round_offset,int shift)

{
  undefined1 auVar1 [32];
  uint in_ECX;
  void *in_RDX;
  void *in_RSI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar6 [16];
  undefined1 auVar5 [64];
  __m256i *in_stack_00000008;
  __m256i m0_acbd;
  __m256i m0_ac;
  __m256i m_i10;
  __m256i m_i00;
  int i;
  __m256i two_w;
  __m256i one_b;
  __m256i v_maxval;
  int in_stack_fffffffffffffc88;
  int local_2a4;
  void *local_220;
  CONV_BUF_TYPE *local_100;
  CONV_BUF_TYPE *pCStack_f8;
  uint8_t *puStack_f0;
  undefined8 uStack_e8;
  
  auVar6 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar6 = vpinsrw_avx(auVar6,0x40,2);
  auVar6 = vpinsrw_avx(auVar6,0x40,3);
  auVar6 = vpinsrw_avx(auVar6,0x40,4);
  auVar6 = vpinsrw_avx(auVar6,0x40,5);
  auVar6 = vpinsrw_avx(auVar6,0x40,6);
  vpinsrw_avx(auVar6,0x40,7);
  auVar6 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar6 = vpinsrw_avx(auVar6,0x40,2);
  auVar6 = vpinsrw_avx(auVar6,0x40,3);
  auVar6 = vpinsrw_avx(auVar6,0x40,4);
  auVar6 = vpinsrw_avx(auVar6,0x40,5);
  auVar6 = vpinsrw_avx(auVar6,0x40,6);
  vpinsrw_avx(auVar6,0x40,7);
  auVar6 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar6 = vpinsrb_avx(auVar6,1,2);
  auVar6 = vpinsrb_avx(auVar6,1,3);
  auVar6 = vpinsrb_avx(auVar6,1,4);
  auVar6 = vpinsrb_avx(auVar6,1,5);
  auVar6 = vpinsrb_avx(auVar6,1,6);
  auVar6 = vpinsrb_avx(auVar6,1,7);
  auVar6 = vpinsrb_avx(auVar6,1,8);
  auVar6 = vpinsrb_avx(auVar6,1,9);
  auVar6 = vpinsrb_avx(auVar6,1,10);
  auVar6 = vpinsrb_avx(auVar6,1,0xb);
  auVar6 = vpinsrb_avx(auVar6,1,0xc);
  auVar6 = vpinsrb_avx(auVar6,1,0xd);
  auVar6 = vpinsrb_avx(auVar6,1,0xe);
  auVar6 = vpinsrb_avx(auVar6,1,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar2 = vpinsrb_avx(auVar2,1,2);
  auVar2 = vpinsrb_avx(auVar2,1,3);
  auVar2 = vpinsrb_avx(auVar2,1,4);
  auVar2 = vpinsrb_avx(auVar2,1,5);
  auVar2 = vpinsrb_avx(auVar2,1,6);
  auVar2 = vpinsrb_avx(auVar2,1,7);
  auVar2 = vpinsrb_avx(auVar2,1,8);
  auVar2 = vpinsrb_avx(auVar2,1,9);
  auVar2 = vpinsrb_avx(auVar2,1,10);
  auVar2 = vpinsrb_avx(auVar2,1,0xb);
  auVar2 = vpinsrb_avx(auVar2,1,0xc);
  auVar2 = vpinsrb_avx(auVar2,1,0xd);
  auVar2 = vpinsrb_avx(auVar2,1,0xe);
  auVar2 = vpinsrb_avx(auVar2,1,0xf);
  local_100 = auVar6._0_8_;
  pCStack_f8 = auVar6._8_8_;
  puStack_f0 = auVar2._0_8_;
  uStack_e8 = auVar2._8_8_;
  auVar6 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar6 = vpinsrw_avx(auVar6,2,2);
  auVar6 = vpinsrw_avx(auVar6,2,3);
  auVar6 = vpinsrw_avx(auVar6,2,4);
  auVar6 = vpinsrw_avx(auVar6,2,5);
  auVar6 = vpinsrw_avx(auVar6,2,6);
  auVar6 = vpinsrw_avx(auVar6,2,7);
  auVar2 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar2 = vpinsrw_avx(auVar2,2,2);
  auVar2 = vpinsrw_avx(auVar2,2,3);
  auVar2 = vpinsrw_avx(auVar2,2,4);
  auVar2 = vpinsrw_avx(auVar2,2,5);
  auVar2 = vpinsrw_avx(auVar2,2,6);
  auVar2 = vpinsrw_avx(auVar2,2,7);
  auVar2 = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar2;
  auVar6 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
  auVar5 = ZEXT3264(CONCAT1616(auVar6,auVar2));
  local_220 = in_RDX;
  for (local_2a4 = 0; auVar3 = auVar5._0_32_, local_2a4 < (int)mask_stride;
      local_2a4 = local_2a4 + 1) {
    yy_loadu_256(in_stack_00000008,in_RSI);
    auVar4 = auVar3;
    yy_loadu_256((__m256i *)((long)*in_stack_00000008 + ((ulong)mask & 0xffffffff)),in_RSI);
    auVar3 = vpaddusb_avx2(auVar3,auVar4);
    auVar4._8_8_ = pCStack_f8;
    auVar4._0_8_ = local_100;
    auVar4._16_8_ = puStack_f0;
    auVar4._24_8_ = uStack_e8;
    auVar3 = vpmaddubsw_avx2(auVar3,auVar4);
    auVar1._16_8_ = auVar6._0_8_;
    auVar1._0_16_ = auVar2;
    auVar1._24_8_ = auVar6._8_8_;
    auVar3 = vpaddw_avx2(auVar3,auVar1);
    auVar3 = vpsrlw_avx2(auVar3,ZEXT416(2));
    auVar5 = ZEXT1664(auVar3._0_16_);
    in_RSI = local_220;
    blend_a64_d16_mask_w16_avx2
              (puStack_f0,pCStack_f8,local_100,auVar6._8_8_,auVar6._0_8_,auVar2._8_8_,
               in_stack_fffffffffffffc88);
    in_stack_00000008 = (__m256i *)((long)*in_stack_00000008 + (ulong)(uint)((int)mask << 1));
    local_220 = (void *)((long)local_220 + (ulong)in_ECX * 2);
  }
  return;
}

Assistant:

static inline void lowbd_blend_a64_d16_mask_subw1_subh1_w16_avx2(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m256i *round_offset, int shift) {
  const __m256i v_maxval = _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m256i one_b = _mm256_set1_epi8(1);
  const __m256i two_w = _mm256_set1_epi16(2);
  for (int i = 0; i < h; ++i) {
    const __m256i m_i00 = yy_loadu_256(mask);
    const __m256i m_i10 = yy_loadu_256(mask + mask_stride);

    const __m256i m0_ac = _mm256_adds_epu8(m_i00, m_i10);
    const __m256i m0_acbd = _mm256_maddubs_epi16(m0_ac, one_b);
    const __m256i m0 = _mm256_srli_epi16(_mm256_add_epi16(m0_acbd, two_w), 2);

    blend_a64_d16_mask_w16_avx2(dst, src0, src1, &m0, round_offset, &v_maxval,
                                shift);
    mask += mask_stride << 1;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}